

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O1

void __thiscall chrono::ChLinkLock::UpdateForces(ChLinkLock *this,double mytime)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChLinkForce *pCVar4;
  ChLinkLimit *pCVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  ChVector<double> arm_xaxis;
  double local_a0;
  double local_98;
  double local_90;
  ChVector<double> local_28;
  undefined1 auVar39 [16];
  
  ChLinkMarkers::UpdateForces(&this->super_ChLinkMarkers,mytime);
  pCVar4 = (this->force_D)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    dVar9 = ChLinkForce::GetForce
                      (pCVar4,(this->super_ChLinkMarkers).dist - this->d_restlength,
                       (this->super_ChLinkMarkers).dist_dt,
                       (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem
                       .super_ChObj.ChTime);
    dVar12 = (this->super_ChLinkMarkers).relM.pos.m_data[0];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar12;
    dVar13 = (this->super_ChLinkMarkers).relM.pos.m_data[1];
    dVar11 = (this->super_ChLinkMarkers).relM.pos.m_data[2];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar11;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar13 * dVar13;
    auVar16 = vfmadd231sd_fma(auVar16,auVar35,auVar35);
    auVar16 = vfmadd231sd_fma(auVar16,auVar27,auVar27);
    if (auVar16._0_8_ < 0.0) {
      dVar10 = sqrt(auVar16._0_8_);
    }
    else {
      auVar16 = vsqrtsd_avx(auVar16,auVar16);
      dVar10 = auVar16._0_8_;
    }
    bVar6 = 2.2250738585072014e-308 <= dVar10;
    dVar10 = 1.0 / dVar10;
    dVar38 = (this->super_ChLinkMarkers).C_force.m_data[2];
    dVar14 = (this->super_ChLinkMarkers).C_force.m_data[1];
    (this->super_ChLinkMarkers).C_force.m_data[0] =
         dVar9 * (double)((ulong)bVar6 * (long)(dVar12 * dVar10) +
                         (ulong)!bVar6 * 0x3ff0000000000000) +
         (this->super_ChLinkMarkers).C_force.m_data[0];
    (this->super_ChLinkMarkers).C_force.m_data[1] =
         dVar9 * (double)((ulong)bVar6 * (long)(dVar13 * dVar10)) + dVar14;
    (this->super_ChLinkMarkers).C_force.m_data[2] =
         dVar9 * (double)((ulong)bVar6 * (long)(dVar11 * dVar10)) + dVar38;
  }
  pCVar4 = (this->force_R)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    dVar10 = ChLinkForce::GetForce
                       (pCVar4,(this->super_ChLinkMarkers).relAngle,0.0,
                        (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.
                        super_ChPhysicsItem.super_ChObj.ChTime);
    dVar12 = (this->super_ChLinkMarkers).relAxis.m_data[2];
    dVar13 = (this->super_ChLinkMarkers).C_torque.m_data[2];
    dVar11 = (this->super_ChLinkMarkers).relAxis.m_data[1];
    dVar9 = (this->super_ChLinkMarkers).C_torque.m_data[1];
    (this->super_ChLinkMarkers).C_torque.m_data[0] =
         dVar10 * (this->super_ChLinkMarkers).relAxis.m_data[0] +
         (this->super_ChLinkMarkers).C_torque.m_data[0];
    (this->super_ChLinkMarkers).C_torque.m_data[1] = dVar10 * dVar11 + dVar9;
    (this->super_ChLinkMarkers).C_torque.m_data[2] = dVar10 * dVar12 + dVar13;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (this->super_ChLinkMarkers).relWvel.m_data[0];
    dVar12 = (this->super_ChLinkMarkers).relWvel.m_data[1];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar12 * dVar12;
    auVar16 = vfmadd231sd_fma(auVar24,auVar17,auVar17);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (this->super_ChLinkMarkers).relWvel.m_data[2];
    auVar16 = vfmadd213sd_fma(auVar18,auVar18,auVar16);
    if (auVar16._0_8_ < 0.0) {
      dVar12 = sqrt(auVar16._0_8_);
    }
    else {
      auVar16 = vsqrtsd_avx(auVar16,auVar16);
      dVar12 = auVar16._0_8_;
    }
    dVar9 = ChLinkForce::GetForce
                      ((this->force_R)._M_t.
                       super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>
                       .super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl,0.0,dVar12,
                       (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem
                       .super_ChObj.ChTime);
    dVar12 = (this->super_ChLinkMarkers).relWvel.m_data[0];
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar12;
    dVar13 = (this->super_ChLinkMarkers).relWvel.m_data[1];
    dVar11 = (this->super_ChLinkMarkers).relWvel.m_data[2];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar11;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar13 * dVar13;
    auVar16 = vfmadd231sd_fma(auVar19,auVar36,auVar36);
    auVar16 = vfmadd231sd_fma(auVar16,auVar28,auVar28);
    if (auVar16._0_8_ < 0.0) {
      dVar10 = sqrt(auVar16._0_8_);
    }
    else {
      auVar16 = vsqrtsd_avx(auVar16,auVar16);
      dVar10 = auVar16._0_8_;
    }
    bVar6 = 2.2250738585072014e-308 <= dVar10;
    dVar10 = 1.0 / dVar10;
    dVar38 = (this->super_ChLinkMarkers).C_torque.m_data[2];
    dVar14 = (this->super_ChLinkMarkers).C_torque.m_data[1];
    (this->super_ChLinkMarkers).C_torque.m_data[0] =
         dVar9 * (double)((ulong)bVar6 * (long)(dVar12 * dVar10) +
                         (ulong)!bVar6 * 0x3ff0000000000000) +
         (this->super_ChLinkMarkers).C_torque.m_data[0];
    (this->super_ChLinkMarkers).C_torque.m_data[1] =
         dVar9 * (double)((ulong)bVar6 * (long)(dVar13 * dVar10)) + dVar14;
    (this->super_ChLinkMarkers).C_torque.m_data[2] =
         dVar9 * (double)((ulong)bVar6 * (long)(dVar11 * dVar10)) + dVar38;
  }
  dVar13 = DAT_00b90ac8;
  dVar12 = DAT_00b90ac0;
  pCVar4 = (this->force_X)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  dVar11 = VNULL;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    dVar11 = ChLinkForce::GetForce
                       (pCVar4,(this->super_ChLinkMarkers).relM.pos.m_data[0],
                        (this->super_ChLinkMarkers).relM_dt.pos.m_data[0],
                        (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.
                        super_ChPhysicsItem.super_ChObj.ChTime);
  }
  pCVar4 = (this->force_Y)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    dVar12 = ChLinkForce::GetForce
                       (pCVar4,(this->super_ChLinkMarkers).relM.pos.m_data[1],
                        (this->super_ChLinkMarkers).relM_dt.pos.m_data[1],
                        (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.
                        super_ChPhysicsItem.super_ChObj.ChTime);
  }
  pCVar4 = (this->force_Z)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    dVar13 = ChLinkForce::GetForce
                       (pCVar4,(this->super_ChLinkMarkers).relM.pos.m_data[2],
                        (this->super_ChLinkMarkers).relM_dt.pos.m_data[2],
                        (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.
                        super_ChPhysicsItem.super_ChObj.ChTime);
  }
  dVar9 = (this->super_ChLinkMarkers).C_force.m_data[2];
  dVar10 = (this->super_ChLinkMarkers).C_force.m_data[1];
  (this->super_ChLinkMarkers).C_force.m_data[0] =
       dVar11 + (this->super_ChLinkMarkers).C_force.m_data[0];
  (this->super_ChLinkMarkers).C_force.m_data[1] = dVar12 + dVar10;
  (this->super_ChLinkMarkers).C_force.m_data[2] = dVar13 + dVar9;
  dVar13 = DAT_00b90ac8;
  dVar12 = DAT_00b90ac0;
  pCVar4 = (this->force_Rx)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  dVar11 = VNULL;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    dVar11 = ChLinkForce::GetForce
                       (pCVar4,(this->super_ChLinkMarkers).relRotaxis.m_data[0],
                        (this->super_ChLinkMarkers).relWvel.m_data[0],
                        (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.
                        super_ChPhysicsItem.super_ChObj.ChTime);
  }
  pCVar4 = (this->force_Ry)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    dVar12 = ChLinkForce::GetForce
                       (pCVar4,(this->super_ChLinkMarkers).relRotaxis.m_data[1],
                        (this->super_ChLinkMarkers).relWvel.m_data[1],
                        (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.
                        super_ChPhysicsItem.super_ChObj.ChTime);
  }
  pCVar4 = (this->force_Rz)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkForce *)0x0) && (pCVar4->m_active == true)) {
    dVar13 = ChLinkForce::GetForce
                       (pCVar4,(this->super_ChLinkMarkers).relRotaxis.m_data[2],
                        (this->super_ChLinkMarkers).relWvel.m_data[2],
                        (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.
                        super_ChPhysicsItem.super_ChObj.ChTime);
  }
  dVar9 = (this->super_ChLinkMarkers).C_torque.m_data[2];
  dVar10 = (this->super_ChLinkMarkers).C_torque.m_data[1];
  (this->super_ChLinkMarkers).C_torque.m_data[0] =
       dVar11 + (this->super_ChLinkMarkers).C_torque.m_data[0];
  (this->super_ChLinkMarkers).C_torque.m_data[1] = dVar12 + dVar10;
  (this->super_ChLinkMarkers).C_torque.m_data[2] = dVar13 + dVar9;
  dVar13 = DAT_00b90ac8;
  dVar12 = DAT_00b90ac0;
  pCVar5 = (this->limit_X)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  local_98 = VNULL;
  local_a0 = VNULL;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    local_a0 = ChLinkLimit::GetForce
                         (pCVar5,(this->super_ChLinkMarkers).relM.pos.m_data[0],
                          (this->super_ChLinkMarkers).relM_dt.pos.m_data[0]);
  }
  pCVar5 = (this->limit_Y)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  local_90 = dVar12;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    local_90 = ChLinkLimit::GetForce
                         (pCVar5,(this->super_ChLinkMarkers).relM.pos.m_data[1],
                          (this->super_ChLinkMarkers).relM_dt.pos.m_data[1]);
  }
  pCVar5 = (this->limit_Z)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  dVar11 = dVar13;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    dVar11 = ChLinkLimit::GetForce
                       (pCVar5,(this->super_ChLinkMarkers).relM.pos.m_data[2],
                        (this->super_ChLinkMarkers).relM_dt.pos.m_data[2]);
  }
  pCVar5 = (this->limit_D)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    dVar9 = (this->super_ChLinkMarkers).relM.pos.m_data[0];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar9;
    dVar10 = (this->super_ChLinkMarkers).relM.pos.m_data[1];
    dVar38 = (this->super_ChLinkMarkers).relM.pos.m_data[2];
    auVar33._8_8_ = 0;
    auVar33._0_8_ = dVar38;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar10 * dVar10;
    auVar16 = vfmadd231sd_fma(auVar20,auVar29,auVar29);
    auVar16 = vfmadd231sd_fma(auVar16,auVar33,auVar33);
    if (auVar16._0_8_ < 0.0) {
      dVar14 = sqrt(auVar16._0_8_);
    }
    else {
      auVar16 = vsqrtsd_avx(auVar16,auVar16);
      dVar14 = auVar16._0_8_;
    }
    bVar6 = 2.2250738585072014e-308 <= dVar14;
    dVar14 = 1.0 / dVar14;
    dVar15 = ChLinkLimit::GetForce
                       ((this->limit_D)._M_t.
                        super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
                        .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl,
                        (this->super_ChLinkMarkers).dist,(this->super_ChLinkMarkers).dist_dt);
    local_a0 = local_a0 +
               dVar15 * (double)((ulong)bVar6 * (long)(dVar9 * dVar14) +
                                (ulong)!bVar6 * 0x3ff0000000000000);
    local_90 = local_90 + dVar15 * (double)((ulong)bVar6 * (long)(dVar10 * dVar14));
    dVar11 = dVar11 + dVar15 * (double)((ulong)bVar6 * (long)(dVar38 * dVar14));
  }
  pCVar5 = (this->limit_Rx)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    local_98 = ChLinkLimit::GetForce
                         (pCVar5,(this->super_ChLinkMarkers).relRotaxis.m_data[0],
                          (this->super_ChLinkMarkers).relWvel.m_data[0]);
  }
  pCVar5 = (this->limit_Ry)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    dVar12 = ChLinkLimit::GetForce
                       (pCVar5,(this->super_ChLinkMarkers).relRotaxis.m_data[1],
                        (this->super_ChLinkMarkers).relWvel.m_data[1]);
  }
  pCVar5 = (this->limit_Rz)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    dVar13 = ChLinkLimit::GetForce
                       (pCVar5,(this->super_ChLinkMarkers).relRotaxis.m_data[2],
                        (this->super_ChLinkMarkers).relWvel.m_data[2]);
  }
  pCVar5 = (this->limit_Rp)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    VaxisXfromQuat(&(this->super_ChLinkMarkers).relM.rot);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_28.m_data[2];
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_28.m_data[1] * 0.0 + local_28.m_data[0];
    auVar16 = vfmadd231sd_fma(auVar21,ZEXT816(0) << 0x40,auVar1);
    dVar9 = acos(auVar16._0_8_);
    dVar10 = VangleRX<double>(&local_28);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_28.m_data[1];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_28.m_data[2];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = VECT_X;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = DAT_00b90ad8;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = DAT_00b90ae0;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_28.m_data[1] * DAT_00b90ae0;
    auVar35 = vfmsub231sd_fma(auVar37,auVar31,auVar25);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_28.m_data[2] * VECT_X;
    auVar16 = vfmsub231sd_fma(auVar39,ZEXT816(0),auVar34);
    dVar38 = auVar16._0_8_;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = DAT_00b90ad8 * -0.0;
    auVar16 = vfmadd231sd_fma(auVar32,auVar30,auVar22);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar38 * dVar38;
    auVar27 = vfmadd231sd_fma(auVar23,auVar35,auVar35);
    auVar27 = vfmadd231sd_fma(auVar27,auVar16,auVar16);
    if (auVar27._0_8_ < 0.0) {
      dVar14 = sqrt(auVar27._0_8_);
    }
    else {
      auVar27 = vsqrtsd_avx(auVar27,auVar27);
      dVar14 = auVar27._0_8_;
    }
    bVar6 = 2.2250738585072014e-308 <= dVar14;
    dVar14 = 1.0 / dVar14;
    dVar38 = (double)((ulong)bVar6 * (long)(dVar38 * dVar14));
    auVar7._0_8_ = (double)((ulong)bVar6 * (long)(auVar35._0_8_ * dVar14) +
                           (ulong)!bVar6 * 0x3ff0000000000000);
    auVar7._8_8_ = 0;
    dVar14 = (double)((ulong)bVar6 * (long)(auVar16._0_8_ * dVar14));
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar14;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (this->super_ChLinkMarkers).relWvel.m_data[0];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar38 * (this->super_ChLinkMarkers).relWvel.m_data[1];
    auVar16 = vfmadd231sd_fma(auVar26,auVar7,auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (this->super_ChLinkMarkers).relWvel.m_data[2];
    auVar16 = vfmadd231sd_fma(auVar16,auVar8,auVar3);
    dVar9 = ChLinkLimit::GetPolarForce
                      ((this->limit_Rp)._M_t.
                       super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
                       .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl,dVar9,
                       auVar16._0_8_,dVar10);
    local_98 = local_98 + dVar9 * auVar7._0_8_;
    dVar12 = dVar12 + dVar9 * dVar38;
    dVar13 = dVar13 + dVar9 * dVar14;
  }
  dVar9 = (this->super_ChLinkMarkers).C_force.m_data[2];
  dVar10 = (this->super_ChLinkMarkers).C_force.m_data[1];
  (this->super_ChLinkMarkers).C_force.m_data[0] =
       local_a0 + (this->super_ChLinkMarkers).C_force.m_data[0];
  (this->super_ChLinkMarkers).C_force.m_data[1] = local_90 + dVar10;
  (this->super_ChLinkMarkers).C_force.m_data[2] = dVar11 + dVar9;
  dVar11 = (this->super_ChLinkMarkers).C_torque.m_data[2];
  dVar9 = (this->super_ChLinkMarkers).C_torque.m_data[1];
  (this->super_ChLinkMarkers).C_torque.m_data[0] =
       local_98 + (this->super_ChLinkMarkers).C_torque.m_data[0];
  (this->super_ChLinkMarkers).C_torque.m_data[1] = dVar12 + dVar9;
  (this->super_ChLinkMarkers).C_torque.m_data[2] = dVar13 + dVar11;
  return;
}

Assistant:

void ChLinkLock::UpdateForces(double mytime) {
    ChLinkMarkers::UpdateForces(mytime);

    ChVector<> m_force = VNULL;
    ChVector<> m_torque = VNULL;

    // COMPUTE THE FORCES IN THE LINK, FOR EXAMPLE
    // CAUSED BY SPRINGS
    // NOTE!!!!!   C_force and C_torque   are considered in the reference coordsystem
    // of marker2  (the MAIN marker), and their application point is considered the
    // origin of marker1 (the SLAVE marker)

    // 1)========== the generic spring-damper

    if (force_D && force_D->IsActive()) {
        double dfor;
        dfor = force_D->GetForce((dist - d_restlength), dist_dt, ChTime);
        m_force = Vmul(Vnorm(relM.pos), dfor);

        C_force = Vadd(C_force, m_force);
    }

    // 2)========== the generic torsional spring / torsional damper

    if (force_R && force_R->IsActive()) {
        double tor;
        // 1) the tors. spring
        tor = force_R->GetForce(relAngle, 0, ChTime);
        m_torque = Vmul(relAxis, tor);
        C_torque = Vadd(C_torque, m_torque);
        // 2) the tors. damper
        double angle_dt = Vlength(relWvel);
        tor = force_R->GetForce(0, angle_dt, ChTime);
        m_torque = Vmul(Vnorm(relWvel), tor);
        C_torque = Vadd(C_torque, m_torque);
    }

    // 3)========== the XYZ forces

    m_force = VNULL;

    if (force_X && force_X->IsActive()) {
        m_force.x() = force_X->GetForce(relM.pos.x(), relM_dt.pos.x(), ChTime);
    }

    if (force_Y && force_Y->IsActive()) {
        m_force.y() = force_Y->GetForce(relM.pos.y(), relM_dt.pos.y(), ChTime);
    }

    if (force_Z && force_Z->IsActive()) {
        m_force.z() = force_Z->GetForce(relM.pos.z(), relM_dt.pos.z(), ChTime);
    }

    C_force = Vadd(C_force, m_force);

    // 4)========== the RxRyRz forces (torques)

    m_torque = VNULL;

    if (force_Rx && force_Rx->IsActive()) {
        m_torque.x() = force_Rx->GetForce(relRotaxis.x(), relWvel.x(), ChTime);
    }

    if (force_Ry && force_Ry->IsActive()) {
        m_torque.y() = force_Ry->GetForce(relRotaxis.y(), relWvel.y(), ChTime);
    }

    if (force_Rz && force_Rz->IsActive()) {
        m_torque.z() = force_Rz->GetForce(relRotaxis.z(), relWvel.z(), ChTime);
    }

    C_torque = Vadd(C_torque, m_torque);

    // ========== the link-limits "cushion forces"

    m_force = VNULL;
    m_torque = VNULL;

    if (limit_X && limit_X->IsActive()) {
        m_force.x() = limit_X->GetForce(relM.pos.x(), relM_dt.pos.x());
    }
    if (limit_Y && limit_Y->IsActive()) {
        m_force.y() = limit_Y->GetForce(relM.pos.y(), relM_dt.pos.y());
    }
    if (limit_Z && limit_Z->IsActive()) {
        m_force.z() = limit_Z->GetForce(relM.pos.z(), relM_dt.pos.z());
    }

    if (limit_D && limit_D->IsActive()) {
        m_force = Vadd(m_force, Vmul(Vnorm(relM.pos), limit_D->GetForce(dist, dist_dt)));
    }

    if (limit_Rx && limit_Rx->IsActive()) {
        m_torque.x() = limit_Rx->GetForce(relRotaxis.x(), relWvel.x());
    }
    if (limit_Ry && limit_Ry->IsActive()) {
        m_torque.y() = limit_Ry->GetForce(relRotaxis.y(), relWvel.y());
    }
    if (limit_Rz && limit_Rz->IsActive()) {
        m_torque.z() = limit_Rz->GetForce(relRotaxis.z(), relWvel.z());
    }
    if (limit_Rp && limit_Rp->IsActive()) {
        ChVector<> arm_xaxis = VaxisXfromQuat(relM.rot);  // the X axis of the marker1, respect to m2.
        double zenith = VangleYZplaneNorm(arm_xaxis);     // the angle of m1 Xaxis about normal to YZ plane
        double polar = VangleRX(arm_xaxis);               // the polar angle of m1 Xaxis spinning about m2 Xaxis

        ChVector<> projected_arm(0, arm_xaxis.y(), arm_xaxis.z());
        ChVector<> torq_axis;
        torq_axis = Vcross(VECT_X, projected_arm);
        torq_axis = Vnorm(torq_axis);  // the axis of torque, laying on YZ plane.

        double zenithspeed = Vdot(torq_axis, relWvel);  // the speed of zenith rotation toward cone.

        m_torque = Vadd(m_torque, Vmul(torq_axis, limit_Rp->GetPolarForce(zenith, zenithspeed, polar)));
    }

    C_force = Vadd(C_force, m_force);     // +++
    C_torque = Vadd(C_torque, m_torque);  // +++

    // ========== other forces??
}